

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

BYTE VIRTUALConvertWinFlags(DWORD flProtect)

{
  uint uVar1;
  undefined1 local_d;
  BYTE MemAccessControl;
  DWORD flProtect_local;
  
  uVar1 = flProtect & 0xff;
  if (uVar1 == 1) {
    local_d = '\x04';
  }
  else if (uVar1 == 2) {
    local_d = '\x01';
  }
  else if (uVar1 == 4) {
    local_d = '\x02';
  }
  else if (uVar1 == 0x10) {
    local_d = '\x05';
  }
  else if (uVar1 == 0x20) {
    local_d = '\x06';
  }
  else if (uVar1 == 0x40) {
    local_d = '\x03';
  }
  else {
    local_d = '\0';
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
  }
  return local_d;
}

Assistant:

static BYTE VIRTUALConvertWinFlags( IN DWORD flProtect )
{
    BYTE MemAccessControl = 0;

    switch ( flProtect & 0xff )
    {
    case PAGE_NOACCESS :
        MemAccessControl = VIRTUAL_NOACCESS;
        break;
    case PAGE_READONLY :
        MemAccessControl = VIRTUAL_READONLY;
        break;
    case PAGE_READWRITE :
        MemAccessControl = VIRTUAL_READWRITE;
        break;
    case PAGE_EXECUTE :
        MemAccessControl = VIRTUAL_EXECUTE;
        break;
    case PAGE_EXECUTE_READ :
        MemAccessControl = VIRTUAL_EXECUTE_READ;
        break;
    case PAGE_EXECUTE_READWRITE:
        MemAccessControl = VIRTUAL_EXECUTE_READWRITE;
        break;

    default :
        MemAccessControl = 0;
        ERROR( "Incorrect or no protection flags specified.\n" );
        break;
    }
    return MemAccessControl;
}